

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFilesCommand.cxx
# Opt level: O3

string * __thiscall
cmInstallFilesCommand::FindInstallSource_abi_cxx11_
          (string *__return_storage_ptr__,cmInstallFilesCommand *this,char *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bool bVar4;
  size_type sVar5;
  string *psVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  string local_68;
  string local_48;
  
  bVar4 = cmsys::SystemTools::FileIsFullPath(name);
  if (bVar4) {
LAB_002755ce:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,name,(allocator<char> *)&local_68);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,name,(allocator<char> *)&local_48);
  sVar5 = cmGeneratorExpression::Find(&local_68);
  paVar1 = &local_68.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (sVar5 == 0) goto LAB_002755ce;
  psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
  pcVar3 = (psVar6->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar3,pcVar3 + psVar6->_M_string_length);
  std::__cxx11::string::append((char *)&local_68);
  std::__cxx11::string::append((char *)&local_68);
  psVar6 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
  paVar2 = &local_48.field_2;
  pcVar3 = (psVar6->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar3,pcVar3 + psVar6->_M_string_length);
  std::__cxx11::string::append((char *)&local_48);
  std::__cxx11::string::append((char *)&local_48);
  bVar4 = cmsys::SystemTools::FileExists(&local_68);
  if (bVar4) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == paVar1) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           local_68.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_68.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_68._M_dataplus._M_p;
LAB_0027561a:
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           local_68.field_2._M_allocated_capacity;
    }
  }
  else {
    bVar4 = cmsys::SystemTools::FileExists(&local_48);
    paVar7 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar7;
    if (bVar4) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p == paVar2) {
        paVar7->_M_allocated_capacity = local_48.field_2._M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_48.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_48._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             local_48.field_2._M_allocated_capacity;
      }
      psVar6 = &local_48;
      __return_storage_ptr__->_M_string_length = local_48._M_string_length;
      paVar7 = paVar2;
      local_48._M_dataplus._M_p = (pointer)paVar2;
      goto LAB_00275666;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_68._M_dataplus._M_p;
      goto LAB_0027561a;
    }
    paVar7->_M_allocated_capacity = local_68.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_68.field_2._8_8_;
  }
  psVar6 = &local_68;
  __return_storage_ptr__->_M_string_length = local_68._M_string_length;
  paVar7 = paVar1;
  local_68._M_dataplus._M_p = (pointer)paVar1;
LAB_00275666:
  psVar6->_M_string_length = 0;
  paVar7->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p == paVar1) {
    return __return_storage_ptr__;
  }
  operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallFilesCommand::FindInstallSource(const char* name) const
{
  if (cmSystemTools::FileIsFullPath(name) ||
      cmGeneratorExpression::Find(name) == 0) {
    // This is a full path.
    return name;
  }

  // This is a relative path.
  std::string tb = this->Makefile->GetCurrentBinaryDirectory();
  tb += "/";
  tb += name;
  std::string ts = this->Makefile->GetCurrentSourceDirectory();
  ts += "/";
  ts += name;

  if (cmSystemTools::FileExists(tb)) {
    // The file exists in the binary tree.  Use it.
    return tb;
  }
  if (cmSystemTools::FileExists(ts)) {
    // The file exists in the source tree.  Use it.
    return ts;
  }
  // The file doesn't exist.  Assume it will be present in the
  // binary tree when the install occurs.
  return tb;
}